

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion __thiscall QRegion::intersected(QRegion *this,QRegion *r)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QRegion *in_RDX;
  long *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRegionPrivate *unaff_retaddr;
  QRegion *result;
  QRect rect;
  NonOverlapFunc in_stack_00000078;
  NonOverlapFunc in_stack_00000080;
  OverlapFunc in_stack_00000088;
  QRegionPrivate *in_stack_00000090;
  QRegionPrivate *in_stack_00000098;
  QRegionPrivate *in_stack_000000a0;
  QRegionPrivate *in_stack_ffffffffffffff98;
  QRect *r1;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  QRegionPrivate *local_18;
  QRect *rect_00;
  
  rect_00 = *(QRect **)(in_FS_OFFSET + 0x28);
  r1 = in_RDI;
  bVar1 = isEmptyHelper(*(QRegionPrivate **)(*in_RSI + 8));
  if ((!bVar1) && (bVar1 = isEmptyHelper(in_RDX->d->qt_rgn), !bVar1)) {
    iVar2 = QRect::right((QRect *)0x65012e);
    iVar3 = QRect::left((QRect *)0x650147);
    if (iVar3 <= iVar2) {
      iVar2 = QRect::left((QRect *)0x65016a);
      iVar3 = QRect::right((QRect *)0x650183);
      if (iVar2 <= iVar3) {
        iVar2 = QRect::bottom((QRect *)0x6501a2);
        iVar3 = QRect::top((QRect *)0x6501bb);
        if (iVar3 <= iVar2) {
          iVar3 = QRect::top((QRect *)0x6501da);
          iVar4 = QRect::bottom((QRect *)0x6501f3);
          if (iVar3 <= iVar4) {
            bVar1 = QRegionPrivate::contains
                              ((QRegionPrivate *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff98);
            if (bVar1) {
              QRegion((QRegion *)CONCAT44(iVar2,iVar3),(QRegion *)in_stack_ffffffffffffff98);
            }
            else {
              bVar1 = QRegionPrivate::contains
                                ((QRegionPrivate *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff98);
              if (bVar1) {
                QRegion((QRegion *)CONCAT44(iVar2,iVar3),(QRegion *)in_stack_ffffffffffffff98);
              }
              else if ((in_RDX->d->qt_rgn->numRects == 1) && (**(int **)(*in_RSI + 8) == 1)) {
                qt_rect_intersect_normalized(r1,in_RDI);
                QRegion(in_RDX,(QRect *)CONCAT17(in_stack_ffffffffffffffcf,
                                                 CONCAT16(in_stack_ffffffffffffffce,
                                                          CONCAT15(in_stack_ffffffffffffffcd,
                                                                   in_stack_ffffffffffffffc8))),
                        (RegionType)((ulong)in_RSI >> 0x20));
              }
              else if (in_RDX->d->qt_rgn->numRects == 1) {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)CONCAT44(iVar2,iVar3),(QRegion *)in_stack_ffffffffffffff98);
                detach((QRegion *)CONCAT44(iVar2,iVar3));
                QRegionPrivate::intersect(unaff_retaddr,rect_00);
              }
              else if (**(int **)(*in_RSI + 8) == 1) {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)CONCAT44(iVar2,iVar3),(QRegion *)in_stack_ffffffffffffff98);
                detach((QRegion *)CONCAT44(iVar2,iVar3));
                QRegionPrivate::intersect(unaff_retaddr,rect_00);
              }
              else {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)in_RDI);
                detach((QRegion *)CONCAT44(iVar2,iVar3));
                miRegionOp(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                           in_stack_00000080,in_stack_00000078);
                miSetExtents(local_18);
              }
            }
            goto LAB_0065046b;
          }
        }
      }
    }
  }
  QRegion((QRegion *)in_RDI);
LAB_0065046b:
  if (*(QRect **)(in_FS_OFFSET + 0x28) != rect_00) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)r1;
}

Assistant:

QRegion QRegion::intersected(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn)
        || !EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return QRegion();

    /* this is fully contained in r */
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(*r.d->qt_rgn))
        return r;

    if (r.d->qt_rgn->numRects == 1 && d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(r.d->qt_rgn->extents,
                                                        d->qt_rgn->extents);
        return QRegion(rect);
    } else if (r.d->qt_rgn->numRects == 1) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->intersect(r.d->qt_rgn->extents);
        return result;
    } else if (d->qt_rgn->numRects == 1) {
        QRegion result(r);
        result.detach();
        result.d->qt_rgn->intersect(d->qt_rgn->extents);
        return result;
    }

    QRegion result;
    result.detach();
    miRegionOp(*result.d->qt_rgn, d->qt_rgn, r.d->qt_rgn, miIntersectO, nullptr, nullptr);

    /*
     * Can't alter dest's extents before we call miRegionOp because
     * it might be one of the source regions and miRegionOp depends
     * on the extents of those regions being the same. Besides, this
     * way there's no checking against rectangles that will be nuked
     * due to coalescing, so we have to examine fewer rectangles.
     */
    miSetExtents(*result.d->qt_rgn);
    return result;
}